

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.hpp
# Opt level: O2

VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *
Fossilize::find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
          (VkStructureType type,void *pNext)

{
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *pVVar1;
  undefined4 in_register_0000003c;
  
  for (pVVar1 = (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)
                CONCAT44(in_register_0000003c,type);
      (pVVar1 != (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)0x0 &&
      (pVVar1->sType != VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO))
      ; pVVar1 = (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)pVVar1->pNext) {
  }
  return pVVar1;
}

Assistant:

static inline const T *find_pnext(VkStructureType type, const void *pNext)
{
	while (pNext != nullptr)
	{
		auto *sin = static_cast<const VkBaseInStructure *>(pNext);
		if (sin->sType == type)
			return static_cast<const T*>(pNext);

		pNext = sin->pNext;
	}

	return nullptr;
}